

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_bitput.c
# Opt level: O0

void mpp_put_bits(BitputCtx_t *bp,RK_U64 invalue,RK_S32 lbits)

{
  byte bVar1;
  ulong uVar2;
  RK_U8 hbits;
  RK_S32 lbits_local;
  RK_U64 invalue_local;
  BitputCtx_t *bp_local;
  
  if ((lbits != 0) && (bp->index < bp->buflen)) {
    bVar1 = 0x40 - (char)lbits;
    uVar2 = (invalue << (bVar1 & 0x3f)) >> (bVar1 & 0x3f);
    bp->bvalue = uVar2 << (bp->bitpos & 0x3f) | bp->bvalue;
    if (0x3f < (int)((uint)bp->bitpos + lbits)) {
      bp->pbuf[bp->index] = bp->bvalue;
      bp->bvalue = uVar2 >> (0x40 - bp->bitpos & 0x3f);
      bp->index = bp->index + 1;
    }
    if (bp->index < bp->buflen) {
      bp->pbuf[bp->index] = bp->bvalue;
      bp->bitpos = bp->bitpos + (char)lbits & 0x3f;
    }
  }
  return;
}

Assistant:

void mpp_put_bits(BitputCtx_t *bp, RK_U64 invalue, RK_S32 lbits)
{
    RK_U8 hbits = 0;

    if (!lbits) return;

    if (bp->index >= bp->buflen) return;

    hbits = 64 - lbits;
    invalue = (invalue << hbits) >> hbits;
    bp->bvalue |= invalue << bp->bitpos;  // high bits value
    if ((bp->bitpos + lbits) >= 64) {
        bp->pbuf[bp->index] = bp->bvalue;
        bp->bvalue = invalue >> (64 - bp->bitpos);  // low bits value
        bp->index++;
    }

    if (bp->index >= bp->buflen)
        return;

    bp->pbuf[bp->index] = bp->bvalue;
    bp->bitpos = (bp->bitpos + lbits) & 63;
    // mpp_log("bp->index = %d bp->bitpos = %d lbits = %d invalue 0x%x bp->hvalue 0x%x  bp->lvalue 0x%x",bp->index,bp->bitpos,lbits, (RK_U32)invalue,(RK_U32)(bp->bvalue >> 32),(RK_U32)bp->bvalue);
}